

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

int qstrnicmp(char *str1,qsizetype len1,char *str2,qsizetype len2)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  ulong uVar4;
  qsizetype qVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  
  uVar4 = CONCAT71((int7)((ulong)in_RAX >> 8),str1 != (char *)0x0);
  iVar3 = (int)uVar4;
  if (str1 == (char *)0x0 || len1 == 0) {
    iVar3 = 0;
    if (len2 != 0) {
      if (len2 == -1) {
        if (str2 != (char *)0x0) {
          return -(uint)(*str2 != '\0');
        }
      }
      else {
        iVar3 = -1;
      }
    }
    return iVar3;
  }
  if (str2 == (char *)0x0) {
    return 1;
  }
  if (len2 == -1) {
    if (len1 < 1) {
      len1 = 0;
    }
    else {
      lVar6 = 0;
      do {
        uVar8 = (uint)str2[lVar6];
        if (str2[lVar6] == '\0') {
          bVar10 = false;
          uVar4 = 1;
        }
        else {
          uVar7 = (uint)str1[lVar6];
          uVar2 = uVar7 + 0x20 & 0xff;
          if (0x19 < uVar7 - 0x41) {
            uVar2 = uVar7;
          }
          uVar7 = uVar8 + 0x20 & 0xff;
          if (0x19 < uVar8 - 0x41) {
            uVar7 = uVar8;
          }
          bVar10 = (char)uVar2 == (char)uVar7;
          uVar4 = uVar4 & 0xffffffff;
          if (!bVar10) {
            uVar4 = (ulong)((uVar2 & 0xff) - (uVar7 & 0xff));
          }
        }
        if (!bVar10) {
          return (int)uVar4;
        }
        lVar6 = lVar6 + 1;
      } while (len1 != lVar6);
    }
    iVar3 = -(uint)(str2[len1] != '\0');
  }
  else {
    qVar5 = len2;
    if (len1 < len2) {
      qVar5 = len1;
    }
    bVar10 = 0 < qVar5;
    if (0 < qVar5) {
      uVar2 = (uint)*str1;
      uVar7 = (uint)*str2;
      uVar8 = uVar2 + 0x20 & 0xff;
      if (0x19 < uVar2 - 0x41) {
        uVar8 = uVar2;
      }
      uVar2 = uVar7 + 0x20 & 0xff;
      if (0x19 < uVar7 - 0x41) {
        uVar2 = uVar7;
      }
      iVar3 = (uVar8 & 0xff) - (uVar2 & 0xff);
      if ((char)uVar8 == (char)uVar2) {
        lVar6 = 1;
        do {
          lVar9 = lVar6;
          iVar1 = iVar3;
          if (qVar5 == lVar9) break;
          uVar2 = (uint)str1[lVar9];
          uVar8 = uVar2 + 0x20 & 0xff;
          if (0x19 < uVar2 - 0x41) {
            uVar8 = uVar2;
          }
          uVar7 = (uint)str2[lVar9];
          uVar2 = uVar7 + 0x20 & 0xff;
          if (0x19 < uVar7 - 0x41) {
            uVar2 = uVar7;
          }
          lVar6 = lVar9 + 1;
          iVar1 = (uVar8 & 0xff) - (uVar2 & 0xff);
        } while ((char)uVar8 == (char)uVar2);
        iVar3 = iVar1;
        bVar10 = lVar9 < qVar5;
      }
    }
    if (!bVar10) {
      iVar3 = ((len2 <= len1) - 1) + (uint)(len2 <= len1);
      if (len1 == len2) {
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int qstrnicmp(const char *str1, qsizetype len1, const char *str2, qsizetype len2)
{
    Q_ASSERT(len1 >= 0);
    Q_ASSERT(len2 >= -1);
    const uchar *s1 = reinterpret_cast<const uchar *>(str1);
    const uchar *s2 = reinterpret_cast<const uchar *>(str2);
    if (!s1 || !len1) {
        if (len2 == 0)
            return 0;
        if (len2 == -1)
            return (!s2 || !*s2) ? 0 : -1;
        Q_ASSERT(s2);
        return -1;
    }
    if (!s2)
        return len1 == 0 ? 0 : 1;

    if (len2 == -1) {
        // null-terminated str2
        qsizetype i;
        for (i = 0; i < len1; ++i) {
            const uchar c = s2[i];
            if (!c)
                return 1;

            if (int res = QtMiscUtils::caseCompareAscii(s1[i], c))
                return res;
        }
        return s2[i] ? -1 : 0;
    } else {
        // not null-terminated
        const qsizetype len = qMin(len1, len2);
        for (qsizetype i = 0; i < len; ++i) {
            if (int res = QtMiscUtils::caseCompareAscii(s1[i], s2[i]))
                return res;
        }
        if (len1 == len2)
            return 0;
        return len1 < len2 ? -1 : 1;
    }
}